

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memwatch.c
# Opt level: O0

int mwIsSafeAddr(void *p,uint len)

{
  char cVar1;
  int iVar2;
  char *local_28;
  char *ptr;
  uint len_local;
  void *p_local;
  
  if (p == (void *)0x0) {
    p_local._4_4_ = 0;
  }
  else if (len == 0) {
    p_local._4_4_ = 1;
  }
  else {
    mwOldSIGSEGV = (mwSignalHandlerPtr)signal(0xb,mwSIGSEGV);
    iVar2 = _setjmp((__jmp_buf_tag *)mwSIGSEGVjump);
    if (iVar2 == 0) {
      local_28 = (char *)((long)p + (ulong)len);
      do {
        local_28 = local_28 + -1;
        cVar1 = mwDummy(*local_28);
        *local_28 = cVar1;
      } while (local_28 != (char *)p);
      signal(0xb,(__sighandler_t)mwOldSIGSEGV);
      p_local._4_4_ = 1;
    }
    else {
      signal(0xb,(__sighandler_t)mwOldSIGSEGV);
      p_local._4_4_ = 0;
    }
  }
  return p_local._4_4_;
}

Assistant:

int mwIsSafeAddr(void *p, unsigned len)
{
	char *ptr;

	if (p == NULL) {
		return 0;
	}
	if (!len) {
		return 1;
	}

	/* set up to catch the SIGSEGV signal */
	mwOldSIGSEGV = signal(SIGSEGV, mwSIGSEGV);

	if (setjmp(mwSIGSEGVjump)) {
		signal(SIGSEGV, mwOldSIGSEGV);
		return 0;
	}

	/* read and write-back all the bytes in the range */
	ptr = (char *)p;
	ptr += len;

	/* the reason for this rather strange construct is that */
	/* we want to keep the number of used parameters and locals */
	/* to a minimum. if we use len for a counter gcc will complain */
	/* it may get clobbered by longjmp() at high warning levels. */
	/* it's a harmless warning, but this way we don't have to see it. */
	do {
		ptr --;
		*ptr = mwDummy(*ptr);
	} while ((void *) ptr != p);

	/* remove the handler */
	signal(SIGSEGV, mwOldSIGSEGV);

	return 1;
}